

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# badguys.c
# Opt level: O2

void draw_badguys(int r,int g,int b,_func_int_float_ptr_int_ptr_int *project)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  BADGUY *pBVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ALLEGRO_COLOR AVar5;
  undefined8 local_b8;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  int ishape [12];
  
  pBVar4 = evildudes;
  AVar5 = makecol(r,g,b);
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_8_ = AVar5._0_8_;
  local_78._12_4_ = extraout_XMM0_Dd;
  local_88._8_4_ = in_XMM1_Dc;
  local_88._0_8_ = AVar5._8_8_;
  local_88._12_4_ = in_XMM1_Dd;
  for (; pBVar4 != (BADGUY *)0x0; pBVar4 = pBVar4->next) {
    if (0.0 < pBVar4->y) {
      local_b8 = CONCAT44(pBVar4->y + 0.01,pBVar4->x + -0.02);
      local_b0 = pBVar4->x;
      local_ac = pBVar4->y + 0.02;
      local_a8 = pBVar4->x + 0.02;
      local_a4 = pBVar4->y + 0.01;
      local_a0 = pBVar4->x + 0.01;
      local_9c = pBVar4->y + 0.005;
      local_98 = pBVar4->x;
      local_94 = pBVar4->y + -0.015;
      local_90 = pBVar4->x + -0.01;
      local_8c = pBVar4->y + 0.005;
      iVar3 = (*project)((float *)&local_b8,ishape,0xc);
      auVar2 = local_78;
      auVar1 = local_88;
      if (iVar3 != 0) {
        AVar5.b = (float)local_88._0_4_;
        AVar5.a = (float)local_88._4_4_;
        AVar5.r = (float)local_78._0_4_;
        AVar5.g = (float)local_78._4_4_;
        local_88 = auVar1;
        local_78 = auVar2;
        polygon(6,ishape,AVar5);
      }
    }
  }
  return;
}

Assistant:

void draw_badguys(int r, int g, int b, int (*project)(float *f, int *i, int c))
{
   BADGUY *bad = evildudes;
   ALLEGRO_COLOR c = makecol(r, g, b);
   float shape[12];
   int ishape[12];

   while (bad) {
      if (bad->y > 0) {
	 shape[0] = bad->x - 0.02;
	 shape[1] = bad->y + 0.01;

	 shape[2] = bad->x;
	 shape[3] = bad->y + 0.02;

	 shape[4] = bad->x + 0.02;
	 shape[5] = bad->y + 0.01;

	 shape[6] = bad->x + 0.01;
	 shape[7] = bad->y + 0.005;

	 shape[8] = bad->x;
	 shape[9] = bad->y - 0.015;

	 shape[10] = bad->x - 0.01;
	 shape[11] = bad->y + 0.005;

	 if (project(shape, ishape, 12))
	    polygon(6, ishape, c);
      }

      bad = bad->next;
   }
}